

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

size_t nivalis::detail::print_ast(ostream *os,AST *ast,Environment *env,size_t idx)

{
  byte bVar1;
  uint uVar2;
  pointer pAVar3;
  pointer pUVar4;
  pointer pbVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  long lVar9;
  size_type sVar10;
  Environment *env_00;
  size_t idx_00;
  ulong uVar11;
  char *pcVar12;
  byte *pbVar13;
  size_t sVar14;
  ulong uVar15;
  byte local_41;
  long local_40;
  Environment *local_38;
  
  pcVar6 = OpCode::repr((ast->
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        )._M_impl.super__Vector_impl_data._M_start[idx].opcode);
  idx_00 = idx + 1;
  pAVar3 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = env;
  if (pAVar3[idx].opcode == 0xc) {
    if (env == (Environment *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"<function id=",0xd);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      pcVar6 = " args>(";
      lVar9 = 7;
    }
    else {
      uVar2 = pAVar3[idx].field_1.call_info[0];
      pUVar4 = (env->funcs).
               super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,pUVar4[uVar2].name._M_dataplus._M_p,pUVar4[uVar2].name._M_string_length
                         );
      pcVar6 = "(";
      lVar9 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,lVar9);
    uVar15 = (ulong)(ast->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_start[idx].field_1.call_info[1];
    if (uVar15 != 0) {
      uVar11 = 0;
      do {
        if (uVar11 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        }
        idx_00 = print_ast(os,ast,local_38,idx_00);
        uVar11 = uVar11 + 1;
      } while (uVar15 != uVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  }
  else {
    local_40 = idx * 0x10;
    sVar8 = strlen(pcVar6);
    if (sVar8 != 0) {
      sVar14 = 0;
      do {
        bVar1 = pcVar6[sVar14];
        if (bVar1 < 0xd) {
          if (bVar1 != 9) {
            if (bVar1 != 0xb) {
LAB_0010a35c:
              sVar10 = 1;
              pbVar13 = &local_41;
              local_41 = bVar1;
              goto LAB_0010a3aa;
            }
            std::ostream::_M_insert<double>
                      (*(double *)
                        ((long)&((ast->
                                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->field_1 + local_40));
          }
        }
        else if (bVar1 == 0xd) {
          if (local_38 == (Environment *)0x0) {
            pcVar12 = "@";
            goto LAB_0010a37e;
          }
          poVar7 = *(ostream **)
                    ((long)&((ast->
                             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             )._M_impl.super__Vector_impl_data._M_start)->field_1 + local_40);
          if (poVar7 < (ostream *)
                       ((long)(local_38->vars).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_38->vars).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3)) {
            pbVar5 = (local_38->varname).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ostream *)
                ((long)(local_38->varname).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5) <= poVar7) {
              pcVar6 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
              print_ast_latex(poVar7,(AST *)pcVar6,env_00,0);
              return (size_t)poVar7;
            }
            pbVar13 = (byte *)pbVar5[(long)poVar7]._M_dataplus._M_p;
            sVar10 = pbVar5[(long)poVar7]._M_string_length;
          }
          else {
            sVar10 = 5;
            pbVar13 = (byte *)0x13314d;
          }
LAB_0010a3aa:
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)pbVar13,sVar10);
        }
        else if (bVar1 == 0x24) {
          pcVar12 = "$";
LAB_0010a37e:
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar12,1);
          std::ostream::_M_insert<unsigned_long>((ulong)os);
        }
        else {
          if (bVar1 != 0x40) goto LAB_0010a35c;
          idx_00 = print_ast(os,ast,local_38,idx_00);
        }
        sVar14 = sVar14 + 1;
      } while (sVar8 != sVar14);
    }
  }
  return idx_00;
}

Assistant:

size_t print_ast(std::ostream& os, const Expr::AST& ast,
               const Environment* env, size_t idx) {
    std::string_view reprs = OpCode::repr(ast[idx].opcode);
    size_t n_idx = idx + 1;
    if (ast[idx].opcode == OpCode::call) {
        // Special handling for user function
        if (env != nullptr) {
            os << env->funcs[ast[idx].call_info[0]].name << "(";
        } else {
            os << "<function id=" << ast[idx].call_info[0] << ", " << ast[idx].call_info[1] << " args>(";
        }
        size_t n_args = ast[idx].call_info[1];
        for (size_t i = 0; i < n_args; ++i) {
            if (i) os << ", ";
            n_idx = print_ast(os, ast, env, n_idx);
        }
        os << ")";
    } else {
        for (char c : reprs) {
            switch(c) {
                case '@': n_idx = print_ast(os, ast, env, n_idx); break; // subexpr
                case '\v': os << ast[idx].val; break; // value
                case '\r':
                          if (env != nullptr) {
                              if (ast[idx].ref >= env->vars.size()) {
                                  os << "&NULL";
                                  break;
                              } os << env->varname.at(ast[idx].ref);
                          }
                          else os << "@" << ast[idx].ref;
                          break; // ref
                case '\t':
                          // Not used
                          break;
                case '$':
                          os << "$" << ast[idx].ref;
                          break;
                default: os << c;
            }
        }
    }
    return n_idx;
}